

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_sort(secp256k1_context *ctx,secp256k1_pubkey **pubkeys,size_t n_pubkeys)

{
  secp256k1_pubkey *psVar1;
  bool bVar2;
  _func_int_void_ptr_void_ptr_void_ptr *in_R8;
  void *in_R9;
  ulong uVar3;
  uchar *a;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_pubkey_sort_cold_2();
  }
  else if (pubkeys != (secp256k1_pubkey **)0x0) {
    if (1 < n_pubkeys) {
      uVar3 = n_pubkeys >> 1;
      do {
        uVar3 = uVar3 - 1;
        secp256k1_heap_down((uchar *)pubkeys,uVar3,n_pubkeys,(size_t)ctx,in_R8,in_R9);
      } while (uVar3 != 0);
    }
    if (n_pubkeys < 2) {
      return 1;
    }
    uVar3 = n_pubkeys - 1;
    do {
      psVar1 = *pubkeys;
      *pubkeys = pubkeys[uVar3];
      pubkeys[uVar3] = psVar1;
      secp256k1_heap_down((uchar *)pubkeys,0,uVar3,(size_t)ctx,in_R8,in_R9);
      bVar2 = 1 < uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar2);
    return 1;
  }
  secp256k1_ec_pubkey_sort_cold_1();
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_sort(const secp256k1_context* ctx, const secp256k1_pubkey **pubkeys, size_t n_pubkeys) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);

    /* Suppress wrong warning (fixed in MSVC 19.33) */
    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(push)
    #pragma warning(disable: 4090)
    #endif

    /* Casting away const is fine because neither secp256k1_hsort nor
     * secp256k1_ec_pubkey_sort_cmp modify the data pointed to by the cmp_data
     * argument. */
    secp256k1_hsort(pubkeys, n_pubkeys, sizeof(*pubkeys), secp256k1_ec_pubkey_sort_cmp, (void *)ctx);

    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(pop)
    #endif

    return 1;
}